

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcActor *this;
  
  this = (IfcActor *)operator_new(0x138);
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__Object_007e6a70;
  *(undefined8 *)&this[1].super_IfcObject.field_0x20 = 0;
  *(char **)&this[1].super_IfcObject.field_0x28 = "IfcOccupant";
  Assimp::IFC::Schema_2x3::IfcActor::IfcActor(this,&PTR_construction_vtable_24__00817780);
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined ***)&this->super_IfcObject = &PTR__IfcOccupant_008176a0;
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__IfcOccupant_00817768;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcOccupant_008176c8;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcOccupant_008176f0;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcOccupant_00817718;
  *(undefined ***)&this->field_0xf0 = &PTR__IfcOccupant_00817740;
  *(undefined1 **)&this->field_0x100 = &this[1].super_IfcObject.field_0x8;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  this[1].super_IfcObject.field_0x8 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObject>(db,params,(IfcObject *)this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }